

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::span_write_bytes::test_method(span_write_bytes *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  undefined4 local_fc;
  lazy_ostream local_f8;
  undefined1 *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined4 *local_b8;
  undefined **local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined4 **local_98;
  uchar *local_90;
  undefined **local_88;
  undefined1 local_80;
  undefined1 *local_78;
  uchar **local_70;
  char *local_68;
  char *local_60;
  assertion_result local_58;
  array<unsigned_char,_2UL> mut_arr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mut_arr._M_elems[0] = 0xaa;
  mut_arr._M_elems[1] = '\x11';
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x114;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f8.m_empty = false;
  local_f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_b8 = &local_fc;
  local_fc = 0xaa;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_60 = "";
  local_70 = &local_90;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_01389a40;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_b8;
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_013890c8;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_90 = mut_arr._M_elems;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,&local_f8,1,2,REQUIRE,0xf4a999,(size_t)&local_68,0x114,&local_88,"0xaa",
             &local_b0);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x115;
  file_00.m_begin = (iterator)&local_110;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  local_f8.m_empty = false;
  local_f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_90 = mut_arr._M_elems + 1;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(mut_arr._M_elems[1] == '\x11');
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = "";
  local_fc = 0x11;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_60 = "";
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_01389a40;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_90;
  local_b8 = &local_fc;
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_013890c8;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,&local_f8,1,2,REQUIRE,0xf4a9ac,(size_t)&local_68,0x115,&local_88,"0x11",
             &local_b0);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(span_write_bytes)
{
    std::array mut_arr{uint8_t{0xaa}, uint8_t{0xbb}};
    const auto mut_bytes{MakeWritableByteSpan(mut_arr)};
    mut_bytes[1] = std::byte{0x11};
    BOOST_CHECK_EQUAL(mut_arr.at(0), 0xaa);
    BOOST_CHECK_EQUAL(mut_arr.at(1), 0x11);
}